

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m2v_add(m2v *A,m2v *B,m2v *out)

{
  int i;
  int r1;
  
  for (r1 = 0; r1 < A->n_row; r1 = r1 + 1) {
    m2v_copy_row(A,r1,out,r1);
    m2v_multadd_row(B,r1,1,out,r1);
  }
  return;
}

Assistant:

void MV_GEN_N(_add)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* out)
{
	assert(A->n_row == B->n_row);
	assert(A->n_col == B->n_col);
	assert(A->n_row == out->n_row);
	assert(A->n_col == out->n_col);

	for (int i = 0; i < A->n_row; ++i) {
		MV_GEN_N(_copy_row)(A, i, out, i);
		MV_GEN_N(_multadd_row)(B, i, 1, out, i);
	}
}